

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

double __thiscall libDAI::TProb<double>::maxVal(TProb<double> *this)

{
  pointer pdVar1;
  size_t i;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar3 = ZEXT816(0) << 0x40;
  lVar2 = 0;
  while ((long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pdVar1 >> 3 != lVar2) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = pdVar1[lVar2];
    lVar2 = lVar2 + 1;
    auVar3 = vmaxsd_avx(auVar4,auVar3);
  }
  return auVar3._0_8_;
}

Assistant:

T maxVal() const {
                T Z = 0.0;
                for( size_t i = 0; i < size(); i++ ) {
                    if( _p[i] > Z )
                        Z = _p[i];
                }
                return Z;
            }